

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O1

void deqp::gles3::Functional::DepthStencilCaseUtil::getStencilTestValues
               (int stencilBits,int numValues,int *values)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = numValues - numValues / 2;
  if (1 < numValues) {
    uVar4 = 0;
    do {
      values[uVar4] = (int)uVar4;
      uVar4 = uVar4 + 1;
    } while ((uint)(numValues / 2) != uVar4);
  }
  if (0 < (int)uVar3) {
    uVar1 = ~(-1 << ((byte)stencilBits & 0x1f));
    uVar4 = (ulong)uVar3;
    iVar2 = numValues + -1;
    do {
      values[iVar2] = uVar1;
      uVar1 = uVar1 - 1;
      iVar2 = iVar2 + -1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void getStencilTestValues (int stencilBits, int numValues, int* values)
{
	int numLowest		= numValues/2;
	int	numHighest		= numValues-numLowest;
	int	maxVal			= (1<<stencilBits)-1;

	for (int ndx = 0; ndx < numLowest; ndx++)
		values[ndx] = ndx;

	for (int ndx = 0; ndx < numHighest; ndx++)
		values[numValues-ndx-1] = maxVal-ndx;
}